

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  undefined4 uVar2;
  ImGuiTabItem *pIVar3;
  undefined4 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  float fVar7;
  float fVar8;
  ImS16 IVar9;
  ImS16 IVar10;
  ImGuiID IVar11;
  ImGuiTabItemFlags IVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  ImGuiID IVar17;
  ImGuiTabItemFlags IVar18;
  int iVar19;
  int iVar20;
  ImGuiTabItem *pIVar21;
  long lVar22;
  uint uVar23;
  ImGuiTabItem item_tmp;
  undefined1 uStack_9;
  
  if (tab_bar->ReorderRequestTabId != 0) {
    uVar1 = (tab_bar->Tabs).Size;
    if (0 < (long)(int)uVar1) {
      pIVar3 = (tab_bar->Tabs).Data;
      lVar22 = 0;
      pIVar21 = pIVar3;
      while (pIVar21->ID != tab_bar->ReorderRequestTabId) {
        lVar22 = lVar22 + -1;
        pIVar21 = pIVar21 + 1;
        if (-lVar22 == (long)(int)uVar1) {
          return false;
        }
      }
      if ((pIVar21->Flags & 0x20U) != 0) {
        return false;
      }
      uVar23 = (int)tab_bar->ReorderRequestDir - (int)lVar22;
      if (uVar1 <= uVar23) {
        return false;
      }
      if ((pIVar3[uVar23].Flags & 0x20U) != 0) {
        return false;
      }
      if (((pIVar3[uVar23].Flags ^ pIVar21->Flags) & 0xc0U) != 0) {
        return false;
      }
      pIVar3 = pIVar3 + uVar23;
      uVar2._0_2_ = pIVar21->IndexDuringLayout;
      uVar2._2_1_ = pIVar21->WantClose;
      uVar2._3_1_ = pIVar21->field_0x23;
      IVar17 = pIVar21->ID;
      IVar18 = pIVar21->Flags;
      iVar19 = pIVar21->LastFrameVisible;
      iVar20 = pIVar21->LastFrameSelected;
      fVar15 = pIVar21->Offset;
      fVar16 = pIVar21->Width;
      uVar4 = pIVar21->ContentWidth;
      uVar5 = pIVar21->NameOffset;
      uVar6 = pIVar21->BeginOrder;
      uStack_9 = (undefined1)((ushort)uVar6 >> 8);
      *(undefined4 *)((long)&pIVar21->BeginOrder + 1) =
           *(undefined4 *)((long)&pIVar3->BeginOrder + 1);
      IVar11 = pIVar3->ID;
      IVar12 = pIVar3->Flags;
      iVar13 = pIVar3->LastFrameVisible;
      iVar14 = pIVar3->LastFrameSelected;
      fVar7 = pIVar3->Width;
      fVar8 = pIVar3->ContentWidth;
      IVar9 = pIVar3->NameOffset;
      IVar10 = pIVar3->BeginOrder;
      pIVar21->Offset = pIVar3->Offset;
      pIVar21->Width = fVar7;
      pIVar21->ContentWidth = fVar8;
      pIVar21->NameOffset = IVar9;
      pIVar21->BeginOrder = IVar10;
      pIVar21->ID = IVar11;
      pIVar21->Flags = IVar12;
      pIVar21->LastFrameVisible = iVar13;
      pIVar21->LastFrameSelected = iVar14;
      *(uint *)((long)&pIVar3->BeginOrder + 1) = CONCAT31((int3)uVar2,uStack_9);
      pIVar3->Offset = fVar15;
      pIVar3->Width = fVar16;
      pIVar3->ContentWidth = (float)uVar4;
      pIVar3->NameOffset = uVar5;
      pIVar3->BeginOrder = uVar6;
      pIVar3->ID = IVar17;
      pIVar3->Flags = IVar18;
      pIVar3->LastFrameVisible = iVar19;
      pIVar3->LastFrameSelected = iVar20;
      if ((tab_bar->Flags & 0x400000) != 0) {
        MarkIniSettingsDirty();
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}